

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  char **ppcVar6;
  long lStack_40;
  
  uVar5 = (long)end - (long)ptr;
  if ((long)uVar5 < 1) {
    return -1;
  }
  cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  lVar3 = 1;
  lStack_40 = lVar3;
  switch(cVar1) {
  case '\x05':
    if (uVar5 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,ptr,(char *)&switchD_0034b1f9::switchdataD_00490400,(char **)0x1);
    if (iVar4 != 0) {
      lStack_40 = 2;
      goto switchD_0034b1f9_caseD_16;
    }
    break;
  case '\x06':
    if (uVar5 < 3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,ptr,(char *)&switchD_0034b1f9::switchdataD_00490400,(char **)0x1);
    lStack_40 = 3;
    goto LAB_0034b264;
  case '\a':
    if (uVar5 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)
                      (enc,ptr,(char *)&switchD_0034b1f9::switchdataD_00490400,(char *)0x1);
    lStack_40 = 4;
LAB_0034b264:
    if (iVar4 != 0) {
switchD_0034b1f9_caseD_16:
      ptr = ptr + lStack_40;
      do {
        uVar5 = (long)end - (long)ptr;
        if ((long)uVar5 < 1) {
          return -1;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        ppcVar6 = (char **)(ulong)bVar2;
        lStack_40 = lVar3;
        if (3 < bVar2 - 0x18) {
          if (bVar2 == 5) {
            if (uVar5 == 1) {
              return -2;
            }
            iVar4 = (*enc[3].scanners[0])(enc,ptr,(char *)0x1,ppcVar6);
            lStack_40 = 2;
          }
          else if (bVar2 == 6) {
            if (uVar5 < 3) {
              return -2;
            }
            iVar4 = (*enc[3].scanners[1])(enc,ptr,(char *)0x1,ppcVar6);
            lStack_40 = 3;
          }
          else {
            if (bVar2 != 7) {
              if (bVar2 == 0x16) goto LAB_0034b303;
              if (bVar2 != 0x12) break;
              ptr = (char *)((byte *)ptr + 1);
              iVar4 = 0x1c;
              goto LAB_0034b31c;
            }
            if (uVar5 < 4) {
              return -2;
            }
            iVar4 = (*enc[3].scanners[2])(enc,ptr,(char *)0x1,ppcVar6);
            lStack_40 = 4;
          }
          if (iVar4 == 0) break;
        }
LAB_0034b303:
        ptr = (char *)((byte *)ptr + lStack_40);
      } while( true );
    }
    break;
  case '\b':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x17':
    break;
  case '\t':
  case '\n':
  case '\x15':
switchD_0034b1f9_caseD_9:
    iVar4 = 0x16;
    goto LAB_0034b31c;
  case '\x16':
  case '\x18':
    goto switchD_0034b1f9_caseD_16;
  default:
    if (cVar1 == '\x1e') goto switchD_0034b1f9_caseD_9;
  }
  iVar4 = 0;
LAB_0034b31c:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}